

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O3

void sysbvm_dwarf_debugInfo_attribute_ref1
               (sysbvm_dwarf_debugInfo_builder_t *builder,uintptr_t attribute,uint8_t value)

{
  bool bVar1;
  undefined8 in_RAX;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  do {
    uStack_38._0_6_ =
         CONCAT15((0x7f < attribute) << 7 | (byte)attribute & 0x7f,(undefined5)uStack_38);
    sysbvm_dynarray_add(&builder->abbrev,(void *)((long)&uStack_38 + 5));
    bVar1 = 0x7f < attribute;
    attribute = attribute >> 7;
  } while (bVar1);
  uStack_38._0_7_ = CONCAT16(0x11,(undefined6)uStack_38);
  sysbvm_dynarray_add(&builder->abbrev,(void *)((long)&uStack_38 + 6));
  uStack_38 = CONCAT17(value,(undefined7)uStack_38);
  sysbvm_dynarray_addAll(&builder->info,1,(void *)((long)&uStack_38 + 7));
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_debugInfo_attribute_ref1(sysbvm_dwarf_debugInfo_builder_t *builder, uintptr_t attribute, uint8_t value)
{
    sysbvm_dwarf_encodeULEB128(&builder->abbrev, attribute);
    sysbvm_dwarf_encodeULEB128(&builder->abbrev, DW_FORM_ref1);
    sysbvm_dwarf_encodeByte(&builder->info, value);
}